

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetPHSRHandle(ndicapi *pol,int i)

{
  unsigned_long uVar1;
  int n;
  char *dp;
  int i_local;
  ndicapi *pol_local;
  
  uVar1 = ndiHexToUnsignedLong(pol->PhsrReply,2);
  if ((i < 0) || ((int)uVar1 < i)) {
    pol_local._4_4_ = 0;
  }
  else {
    uVar1 = ndiHexToUnsignedLong(pol->PhsrReply + (long)(i * 5) + 2,2);
    pol_local._4_4_ = (int)uVar1;
  }
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiGetPHSRHandle(ndicapi* pol, int i)
{
  char* dp;
  int n;

  dp = pol->PhsrReply;
  n = (int)ndiHexToUnsignedLong(dp, 2);
  dp += 2;

  if (i < 0 || i > n)
  {
    return 0;
  }
  dp += 5 * i;

  return (int)ndiHexToUnsignedLong(dp, 2);
}